

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::ErrorPrinter::AddErrorOrWarning
          (ErrorPrinter *this,string_view filename,int line,int column,string_view message,
          string_view type,ostream *out)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string dfile;
  
  dfile._M_dataplus._M_p = (pointer)&dfile.field_2;
  dfile._M_string_length = 0;
  dfile.field_2._M_local_buf[0] = '\0';
  if (this->tree_ == (DiskSourceTree *)0x0) {
LAB_001455d9:
    std::__ostream_insert<char,std::char_traits<char>>(out,filename._M_str,filename._M_len);
  }
  else {
    bVar1 = DiskSourceTree::VirtualFileToDiskFile(this->tree_,filename,&dfile);
    if (!bVar1) goto LAB_001455d9;
    std::operator<<(out,(string *)&dfile);
  }
  if (line != -1) {
    if (this->format_ == ERROR_FORMAT_MSVS) {
      poVar2 = std::operator<<(out,"(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,line + 1);
      poVar2 = std::operator<<(poVar2,") : ");
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,type._M_str,type._M_len);
      pcVar3 = " in column=";
    }
    else {
      if (this->format_ != ERROR_FORMAT_GCC) goto LAB_00145680;
      pcVar3 = ":";
      poVar2 = std::operator<<(out,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,line + 1);
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,column + 1);
  }
LAB_00145680:
  __y._M_str = "warning";
  __y._M_len = 7;
  bVar1 = std::operator==(type,__y);
  pcVar3 = ": ";
  if (bVar1) {
    pcVar3 = ": warning: ";
  }
  poVar2 = std::operator<<(out,pcVar3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,message._M_str,message._M_len);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&dfile);
  return;
}

Assistant:

void AddErrorOrWarning(absl::string_view filename, int line, int column,
                         absl::string_view message, absl::string_view type,
                         std::ostream& out) {
    std::string dfile;
    if (
        tree_ != nullptr && tree_->VirtualFileToDiskFile(filename, &dfile)) {
      out << dfile;
    } else {
      out << filename;
    }

    // Users typically expect 1-based line/column numbers, so we add 1
    // to each here.
    if (line != -1) {
      // Allow for both GCC- and Visual-Studio-compatible output.
      switch (format_) {
        case CommandLineInterface::ERROR_FORMAT_GCC:
          out << ":" << (line + 1) << ":" << (column + 1);
          break;
        case CommandLineInterface::ERROR_FORMAT_MSVS:
          out << "(" << (line + 1) << ") : " << type
              << " in column=" << (column + 1);
          break;
      }
    }

    if (type == "warning") {
      out << ": warning: " << message << std::endl;
    } else {
      out << ": " << message << std::endl;
    }
  }